

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O2

void kat::GetRowLegacy(map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                       *data_plt,fin_data *row)

{
  mapped_type *__dest;
  int summary_id;
  int type;
  period_event periodEventID;
  undefined1 auStack_28 [4];
  undefined1 local_24 [4];
  key_type local_20;
  
  __isoc99_sscanf(row->data,"%d,%d,%d,%d",local_24,auStack_28,&local_20,&local_20.eventID);
  __dest = std::
           map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
           ::operator[](data_plt,&local_20);
  memcpy(__dest,row,0x1008);
  return;
}

Assistant:

void GetRowLegacy(std::map<period_event, fin_data> &data_plt,
			  const fin_data &row) {
		// Sort by period number and then event number
		period_event periodEventID;
		int type, summary_id;
		sscanf(row.data, "%d,%d,%d,%d", &type, &summary_id,
		       &periodEventID.period, &periodEventID.eventID);
		data_plt[periodEventID] = row;
	}